

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-base64X.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
YukiWorkshop::Base64X::Decoder<std::__cxx11::string>::decode<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,void *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__input)

{
  char *__input_00;
  size_t __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__input_local;
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __input_00 = (char *)std::__cxx11::string::data();
  __len = std::__cxx11::string::size();
  __decode_to_target((Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,__return_storage_ptr__,__input_00,__len);
  return __return_storage_ptr__;
}

Assistant:

T decode(const T2& __input) {
			T ret;
			__decode_to_target(*this, ret, __input.data(), __input.size());
			return ret;
		}